

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap_lock.c
# Opt level: O0

ALLEGRO_LOCKED_REGION *
al_lock_bitmap_region(ALLEGRO_BITMAP *bitmap,int x,int y,int width,int height,int format,int flags)

{
  int iVar1;
  uint sy;
  int iVar2;
  int mul;
  int iVar3;
  int iVar4;
  int iVar5;
  int format_00;
  uchar *puVar6;
  void *pvVar7;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  ALLEGRO_BITMAP *in_RDI;
  int in_R8D;
  int in_R9D;
  uint in_stack_00000008;
  int f;
  int hc;
  int wc;
  int yc;
  int xc;
  int block_height;
  int block_width;
  int bitmap_flags;
  int bitmap_format;
  ALLEGRO_LOCKED_REGION *lr;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  void *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  int local_24;
  ALLEGRO_BITMAP *local_20;
  ALLEGRO_LOCKED_REGION *local_18;
  
  iVar1 = al_get_bitmap_format(in_RDI);
  sy = al_get_bitmap_flags(in_RDI);
  iVar2 = al_get_pixel_block_width(iVar1);
  mul = al_get_pixel_block_height(iVar1);
  _al_pixel_format_is_real(in_R9D);
  local_24 = in_ESI;
  local_20 = in_RDI;
  if (in_RDI->parent != (ALLEGRO_BITMAP *)0x0) {
    local_24 = in_RDI->xofs + in_ESI;
    in_EDX = in_RDI->yofs + in_EDX;
    local_20 = in_RDI->parent;
  }
  if ((local_20->locked & 1U) == 0) {
    if (((sy & 1) == 0) && ((in_stack_00000008 & 1) == 0)) {
      local_20->dirty = true;
    }
    iVar3 = (local_24 / iVar2) * iVar2;
    iVar4 = (in_EDX / mul) * mul;
    iVar2 = _al_get_least_multiple(local_24 + in_ECX,iVar2);
    iVar2 = iVar2 - iVar3;
    iVar5 = _al_get_least_multiple(in_EDX + in_R8D,mul);
    iVar5 = iVar5 - iVar4;
    local_20->lock_x = iVar3;
    local_20->lock_y = iVar4;
    local_20->lock_w = iVar2;
    local_20->lock_h = iVar5;
    local_20->lock_flags = in_stack_00000008;
    if ((in_stack_00000008 == 2) &&
       ((((iVar3 != local_24 || (iVar4 != in_EDX)) || (iVar2 != in_ECX)) || (iVar5 != in_R8D)))) {
      in_stack_00000008 = 0;
    }
    if ((sy & 1) == 0) {
      local_18 = (*local_20->vt->lock_region)
                           (local_20,iVar3,iVar4,iVar2,iVar5,in_R9D,in_stack_00000008);
      if (local_18 == (ALLEGRO_LOCKED_REGION *)0x0) {
        return (ALLEGRO_LOCKED_REGION *)0x0;
      }
    }
    else {
      al_get_current_display();
      format_00 = _al_get_real_pixel_format
                            ((ALLEGRO_DISPLAY *)
                             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                             in_stack_ffffffffffffff5c);
      if (format_00 < 0) {
        return (ALLEGRO_LOCKED_REGION *)0x0;
      }
      if (((in_R9D == 0) || (iVar1 == in_R9D)) || (iVar1 == format_00)) {
        puVar6 = local_20->memory + local_20->pitch * iVar4;
        iVar2 = al_get_pixel_size(iVar1);
        (local_20->locked_region).data = puVar6 + iVar3 * iVar2;
        (local_20->locked_region).format = iVar1;
        (local_20->locked_region).pitch = local_20->pitch;
        iVar1 = al_get_pixel_size(iVar1);
        (local_20->locked_region).pixel_size = iVar1;
      }
      else {
        iVar1 = al_get_pixel_size(format_00);
        (local_20->locked_region).pitch = iVar1 * iVar2;
        pvVar7 = al_malloc_with_context
                           (CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                            in_stack_ffffffffffffff64,
                            (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                            (char *)0x14572a);
        (local_20->locked_region).data = pvVar7;
        (local_20->locked_region).format = format_00;
        iVar1 = al_get_pixel_size(format_00);
        (local_20->locked_region).pixel_size = iVar1;
        if ((local_20->lock_flags & 2U) == 0) {
          _al_convert_bitmap_data
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
                     (void *)CONCAT44(in_stack_ffffffffffffff84,iVar5),in_stack_ffffffffffffff7c,
                     iVar2,mul,sy,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8,in_R8D,in_EDX)
          ;
        }
      }
      local_18 = &local_20->locked_region;
    }
    local_20->lock_data = local_18->data;
    local_18->data =
         (void *)((long)local_18->data +
                 (long)((in_EDX - iVar4) * local_18->pitch) +
                 (long)((local_24 - iVar3) * local_18->pixel_size));
    local_20->locked = true;
  }
  else {
    local_18 = (ALLEGRO_LOCKED_REGION *)0x0;
  }
  return local_18;
}

Assistant:

ALLEGRO_LOCKED_REGION *al_lock_bitmap_region(ALLEGRO_BITMAP *bitmap,
   int x, int y, int width, int height, int format, int flags)
{
   ALLEGRO_LOCKED_REGION *lr;
   int bitmap_format = al_get_bitmap_format(bitmap);
   int bitmap_flags = al_get_bitmap_flags(bitmap);
   int block_width = al_get_pixel_block_width(bitmap_format);
   int block_height = al_get_pixel_block_height(bitmap_format);
   int xc, yc, wc, hc;
   ASSERT(x >= 0);
   ASSERT(y >= 0);
   ASSERT(width >= 0);
   ASSERT(height >= 0);
   ASSERT(!_al_pixel_format_is_video_only(format));
   if (_al_pixel_format_is_real(format)) {
      ASSERT(al_get_pixel_block_width(format) == 1);
      ASSERT(al_get_pixel_block_height(format) == 1);
   }

   /* For sub-bitmaps */
   if (bitmap->parent) {
      x += bitmap->xofs;
      y += bitmap->yofs;
      bitmap = bitmap->parent;
   }

   if (bitmap->locked)
      return NULL;

   if (!(bitmap_flags & ALLEGRO_MEMORY_BITMAP) &&
         !(flags & ALLEGRO_LOCK_READONLY))
      bitmap->dirty = true;

   ASSERT(x+width <= bitmap->w);
   ASSERT(y+height <= bitmap->h);

   xc = (x / block_width) * block_width;
   yc = (y / block_height) * block_height;
   wc = _al_get_least_multiple(x + width, block_width) - xc;
   hc = _al_get_least_multiple(y + height, block_height) - yc;

   bitmap->lock_x = xc;
   bitmap->lock_y = yc;
   bitmap->lock_w = wc;
   bitmap->lock_h = hc;
   bitmap->lock_flags = flags;

   if (flags == ALLEGRO_LOCK_WRITEONLY &&
       (xc != x || yc != y || wc != width || hc != height)) {
      /* Unaligned write-only access requires that we fill in the padding
       * from the texture.
       * XXX: In principle, this could be done more efficiently. */
      flags = ALLEGRO_LOCK_READWRITE;
   }

   if (bitmap_flags & ALLEGRO_MEMORY_BITMAP) {
      int f = _al_get_real_pixel_format(al_get_current_display(), format);
      if (f < 0) {
         return NULL;
      }
      ASSERT(bitmap->memory);
      if (format == ALLEGRO_PIXEL_FORMAT_ANY || bitmap_format == format || bitmap_format == f) {
         bitmap->locked_region.data = bitmap->memory
            + bitmap->pitch * yc + xc * al_get_pixel_size(bitmap_format);
         bitmap->locked_region.format = bitmap_format;
         bitmap->locked_region.pitch = bitmap->pitch;
         bitmap->locked_region.pixel_size = al_get_pixel_size(bitmap_format);
      }
      else {
         bitmap->locked_region.pitch = al_get_pixel_size(f) * wc;
         bitmap->locked_region.data = al_malloc(bitmap->locked_region.pitch*hc);
         bitmap->locked_region.format = f;
         bitmap->locked_region.pixel_size = al_get_pixel_size(f);
         if (!(bitmap->lock_flags & ALLEGRO_LOCK_WRITEONLY)) {
            _al_convert_bitmap_data(
               bitmap->memory, bitmap_format, bitmap->pitch,
               bitmap->locked_region.data, f, bitmap->locked_region.pitch,
               xc, yc, 0, 0, wc, hc);
         }
      }
      lr = &bitmap->locked_region;
   }
   else {
      lr = bitmap->vt->lock_region(bitmap, xc, yc, wc, hc, format, flags);
      if (!lr) {
         return NULL;
      }
   }

   bitmap->lock_data = lr->data;
   /* Fixup the data pointer for unaligned access */
   lr->data = (char*)lr->data + (x - xc) * lr->pixel_size + (y - yc) * lr->pitch;

   bitmap->locked = true;

   return lr;
}